

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compiler.c++
# Opt level: O0

void __thiscall capnp::compiler::Compiler::load(Compiler *this,SchemaLoader *loader,uint64_t id)

{
  Own<capnp::compiler::Compiler::Impl> *this_00;
  Impl *this_01;
  Maybe<kj::_::Mutex::Waiter_&> *local_20;
  uint64_t id_local;
  SchemaLoader *loader_local;
  Compiler *this_local;
  
  local_20 = (Maybe<kj::_::Mutex::Waiter_&> *)id;
  id_local = (uint64_t)loader;
  loader_local = (SchemaLoader *)this;
  kj::MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl>_>::lockExclusive
            ((MutexGuarded<kj::Own<capnp::compiler::Compiler::Impl>_> *)&stack0xffffffffffffffd0);
  this_00 = kj::Locked<kj::Own<capnp::compiler::Compiler::Impl>_>::operator->
                      ((Locked<kj::Own<capnp::compiler::Compiler::Impl>_> *)&stack0xffffffffffffffd0
                      );
  this_01 = kj::Own<capnp::compiler::Compiler::Impl>::get(this_00);
  Impl::loadFinal(this_01,(SchemaLoader *)id_local,(uint64_t)local_20);
  kj::Locked<kj::Own<capnp::compiler::Compiler::Impl>_>::~Locked
            ((Locked<kj::Own<capnp::compiler::Compiler::Impl>_> *)&stack0xffffffffffffffd0);
  return;
}

Assistant:

void Compiler::load(const SchemaLoader& loader, uint64_t id) const {
  impl.lockExclusive()->get()->loadFinal(loader, id);
}